

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

void Gia_ObjSetAndLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int b;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 != 0) {
    pGVar2 = Gia_ObjFanin0(pObj);
    iVar1 = Gia_ObjLevel(p,pGVar2);
    pGVar2 = Gia_ObjFanin1(pObj);
    b = Gia_ObjLevel(p,pGVar2);
    iVar1 = Abc_MaxInt(iVar1,b);
    Gia_ObjSetLevel(p,pObj,iVar1 + 1);
    return;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x20e,"void Gia_ObjSetAndLevel(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void         Gia_ObjSetAndLevel( Gia_Man_t * p, Gia_Obj_t * pObj ) { assert( Gia_ObjIsAnd(pObj) ); Gia_ObjSetLevel( p, pObj, 1+Abc_MaxInt(Gia_ObjLevel(p,Gia_ObjFanin0(pObj)),Gia_ObjLevel(p,Gia_ObjFanin1(pObj))) ); }